

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_suite.cpp
# Opt level: O0

void test_array_arithmetic(void)

{
  size_type in_RCX;
  basic_variable<std::allocator<char>_> *pbVar1;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  basic_variable<std::allocator<char>_> *local_328;
  basic_variable<std::allocator<char>_> *local_310;
  iterator local_300;
  iterator local_2e8;
  iterator local_2d0;
  iterator local_2b8;
  basic_variable<std::allocator<char>_> *local_2a0;
  basic_variable<std::allocator<char>_> local_298;
  basic_variable<std::allocator<char>_> local_268;
  basic_variable<std::allocator<char>_> local_238;
  undefined1 local_208 [24];
  variable expect;
  iterator local_1b0;
  undefined1 local_198 [8];
  iterator end;
  basic_variable<std::allocator<char>_> local_168;
  basic_variable<std::allocator<char>_> local_138;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_168,false);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_138,0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_108,0.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_d8,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_a8,1.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_78,1);
  local_48._0_8_ = &local_168;
  local_48._8_8_ = 6;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x6;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  pbVar1 = &local_168;
  local_310 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_310 = local_310 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_310);
  } while (local_310 != pbVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1b0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)&expect.storage.field_0x28,
             (basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::unique<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_198,&local_1b0,(iterator *)&expect.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)&expect.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1b0);
  local_2a0 = &local_298;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_2a0,false);
  local_2a0 = &local_268;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2a0,2);
  local_2a0 = &local_238;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_2a0,1.0);
  local_208._0_8_ = &local_298;
  local_208._8_8_ = 3;
  init_00._M_len = (size_type)pbVar1;
  init_00._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_208 + 0x10),
             (basic_array<std::allocator<char>_> *)local_208._0_8_,init_00);
  local_328 = (basic_variable<std::allocator<char>_> *)local_208;
  do {
    local_328 = local_328 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_328);
  } while (local_328 != &local_298);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_2b8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_2d0,(iterator *)local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_2e8,(basic_variable<std::allocator<char>_> *)(local_208 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_300,(basic_variable<std::allocator<char>_> *)(local_208 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/unique_suite.cpp"
             ,0x7c,"void test_array_arithmetic()",&local_2b8,&local_2d0,&local_2e8,&local_300);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_300);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_208 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void test_array_arithmetic()
{
    variable data = array::make({ false, 0, 0.0, 2, 1.0, 1 });
    auto end = std::unique(data.begin(), data.end());
    variable expect = array::make({ false, 2, 1.0 });
    TRIAL_PROTOCOL_TEST_ALL_WITH(data.begin(), end,
                                 expect.begin(), expect.end(),
                                 std::equal_to<variable>());
}